

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_stream_sync_sendbuf(quicly_stream_t *stream,int activate)

{
  int in_ESI;
  quicly_stream_t *in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if ((in_ESI == 0) ||
     (local_4 = quicly_sendstate_activate
                          ((quicly_sendstate_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)),
     local_4 == 0)) {
    resched_stream_data(in_RDI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int quicly_stream_sync_sendbuf(quicly_stream_t *stream, int activate)
{
    int ret;

    if (activate) {
        if ((ret = quicly_sendstate_activate(&stream->sendstate)) != 0)
            return ret;
    }

    resched_stream_data(stream);
    return 0;
}